

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::ping_observer::ping_observer
          (ping_observer *this,shared_ptr<libtorrent::dht::traversal_algorithm> *algorithm,
          endpoint *ep,node_id *id)

{
  shared_ptr<libtorrent::dht::traversal_algorithm> local_28;
  
  local_28.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (algorithm->
           super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_28.super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (algorithm->
       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (algorithm->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (algorithm->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  observer::observer(&this->super_observer,&local_28,ep,id);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_observer)._vptr_observer = (_func_int **)&PTR__observer_004d30b0;
  return;
}

Assistant:

ping_observer(
		std::shared_ptr<traversal_algorithm> algorithm
		, udp::endpoint const& ep, node_id const& id)
		: observer(std::move(algorithm), ep, id)
	{}